

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# display.cpp
# Opt level: O0

bool __thiscall pbrt::DisplayItem::Display(DisplayItem *this,IPCChannel *ipcChannel)

{
  span<pstd::span<float>_> __args_1;
  Bounds2<int> __args;
  bool bVar1;
  size_type sVar2;
  ulong uVar3;
  size_type sVar4;
  uchar *puVar5;
  reference pvVar6;
  reference pvVar7;
  Tuple2<pbrt::Point2,_int> TVar8;
  Tuple2<pbrt::Point2,_int> TVar9;
  ImageChannelBuffer *pIVar10;
  function<void_(pbrt::Bounds2<int>,_pstd::span<pstd::span<float>_>)> *pfVar11;
  ImageChannelBuffer *in_RDI;
  int c_2;
  Bounds2i b;
  int c_1;
  int width;
  int height;
  int x;
  int y;
  int tileIndex;
  Float *ptr;
  int c;
  vector<pstd::span<float>,_std::allocator<pstd::span<float>_>_> displayValues;
  IPCChannel *in_stack_00000328;
  DisplayItem *in_stack_00000330;
  int in_stack_fffffffffffffed8;
  int in_stack_fffffffffffffedc;
  function<void_(pbrt::Bounds2<int>,_pstd::span<pstd::span<float>_>)> *in_stack_fffffffffffffee0;
  undefined4 in_stack_fffffffffffffee8;
  undefined4 in_stack_fffffffffffffeec;
  span<float> *p1;
  ImageChannelBuffer *in_stack_fffffffffffffef0;
  size_type in_stack_fffffffffffffef8;
  vector<pstd::span<float>,_std::allocator<pstd::span<float>_>_> *in_stack_ffffffffffffff00;
  IPCChannel *ipcChannel_00;
  int local_cc;
  int local_80;
  int local_7c;
  int local_78;
  int local_74;
  int local_70;
  int local_6c;
  int local_68;
  int local_64;
  span<float> local_60;
  uchar *local_50;
  int local_48;
  undefined1 local_31 [48];
  byte local_1;
  
  if (((ulong)(in_RDI->buffer).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
              _M_impl.super__Vector_impl_data._M_start & 1) == 0) {
    bVar1 = SendOpenImage(in_stack_00000330,in_stack_00000328);
    if (!bVar1) {
      local_1 = 0;
      goto LAB_00860422;
    }
    *(undefined1 *)
     &(in_RDI->buffer).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start = 1;
  }
  sVar2 = std::
          vector<pbrt::DisplayItem::ImageChannelBuffer,_std::allocator<pbrt::DisplayItem::ImageChannelBuffer>_>
          ::size((vector<pbrt::DisplayItem::ImageChannelBuffer,_std::allocator<pbrt::DisplayItem::ImageChannelBuffer>_>
                  *)&in_RDI[1].tileHashes.
                     super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                     super__Vector_impl_data._M_finish);
  ipcChannel_00 = (IPCChannel *)local_31;
  std::allocator<pstd::span<float>_>::allocator((allocator<pstd::span<float>_> *)0x85ffb9);
  std::vector<pstd::span<float>,_std::allocator<pstd::span<float>_>_>::vector
            (in_stack_ffffffffffffff00,in_stack_fffffffffffffef8,
             (allocator_type *)in_stack_fffffffffffffef0);
  std::allocator<pstd::span<float>_>::~allocator((allocator<pstd::span<float>_> *)0x85ffdf);
  local_48 = 0;
  while( true ) {
    uVar3 = (ulong)local_48;
    sVar4 = std::
            vector<pbrt::DisplayItem::ImageChannelBuffer,_std::allocator<pbrt::DisplayItem::ImageChannelBuffer>_>
            ::size((vector<pbrt::DisplayItem::ImageChannelBuffer,_std::allocator<pbrt::DisplayItem::ImageChannelBuffer>_>
                    *)&in_RDI[1].tileHashes.
                       super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                       super__Vector_impl_data._M_finish);
    p1 = (span<float> *)CONCAT44(in_stack_fffffffffffffeec,in_stack_fffffffffffffee8);
    if (sVar4 <= uVar3) break;
    std::
    vector<pbrt::DisplayItem::ImageChannelBuffer,_std::allocator<pbrt::DisplayItem::ImageChannelBuffer>_>
    ::operator[]((vector<pbrt::DisplayItem::ImageChannelBuffer,_std::allocator<pbrt::DisplayItem::ImageChannelBuffer>_>
                  *)&in_RDI[1].tileHashes.
                     super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                     super__Vector_impl_data._M_finish,(long)local_48);
    puVar5 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::data
                       ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)0x860034);
    pvVar6 = std::
             vector<pbrt::DisplayItem::ImageChannelBuffer,_std::allocator<pbrt::DisplayItem::ImageChannelBuffer>_>
             ::operator[]((vector<pbrt::DisplayItem::ImageChannelBuffer,_std::allocator<pbrt::DisplayItem::ImageChannelBuffer>_>
                           *)&in_RDI[1].tileHashes.
                              super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                              _M_impl.super__Vector_impl_data._M_finish,(long)local_48);
    local_50 = puVar5 + pvVar6->channelValuesOffset;
    local_60 = pstd::MakeSpan<float>
                         ((float *)in_stack_fffffffffffffee0,
                          CONCAT44(in_stack_fffffffffffffedc,in_stack_fffffffffffffed8));
    pvVar7 = std::vector<pstd::span<float>,_std::allocator<pstd::span<float>_>_>::operator[]
                       ((vector<pstd::span<float>,_std::allocator<pstd::span<float>_>_> *)
                        (local_31 + 1),(long)local_48);
    pvVar7->ptr = local_60.ptr;
    pvVar7->n = local_60.n;
    local_48 = local_48 + 1;
  }
  local_64 = 0;
  for (local_68 = 0;
      local_68 <
      *(int *)((long)&(in_RDI->tileHashes).
                      super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                      super__Vector_impl_data._M_finish + 4); local_68 = local_68 + 0x80) {
    for (local_6c = 0;
        local_6c <
        *(int *)&(in_RDI->tileHashes).
                 super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                 super__Vector_impl_data._M_finish; local_6c = local_6c + 0x80) {
      local_74 = local_68 + 0x80;
      TVar8 = (Tuple2<pbrt::Point2,_int>)
              std::min<int>(&local_74,
                            (int *)((long)&(in_RDI->tileHashes).
                                           super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                           ._M_impl.super__Vector_impl_data._M_finish + 4));
      local_70 = *(int *)TVar8 - local_68;
      local_7c = local_6c + 0x80;
      TVar9 = (Tuple2<pbrt::Point2,_int>)
              std::min<int>(&local_7c,
                            (int *)&(in_RDI->tileHashes).
                                    super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                    ._M_impl.super__Vector_impl_data._M_finish);
      local_78 = *(int *)TVar9 - local_6c;
      local_80 = 0;
      while( true ) {
        in_stack_fffffffffffffef0 = (ImageChannelBuffer *)(long)local_80;
        pIVar10 = (ImageChannelBuffer *)
                  std::
                  vector<pbrt::DisplayItem::ImageChannelBuffer,_std::allocator<pbrt::DisplayItem::ImageChannelBuffer>_>
                  ::size((vector<pbrt::DisplayItem::ImageChannelBuffer,_std::allocator<pbrt::DisplayItem::ImageChannelBuffer>_>
                          *)&in_RDI[1].tileHashes.
                             super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                             _M_impl.super__Vector_impl_data._M_finish);
        if (pIVar10 <= in_stack_fffffffffffffef0) break;
        std::
        vector<pbrt::DisplayItem::ImageChannelBuffer,_std::allocator<pbrt::DisplayItem::ImageChannelBuffer>_>
        ::operator[]((vector<pbrt::DisplayItem::ImageChannelBuffer,_std::allocator<pbrt::DisplayItem::ImageChannelBuffer>_>
                      *)&in_RDI[1].tileHashes.
                         super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                         super__Vector_impl_data._M_finish,(long)local_80);
        ImageChannelBuffer::SetTileBounds
                  (in_stack_fffffffffffffef0,(int)((ulong)p1 >> 0x20),(int)p1,
                   (int)((ulong)in_stack_fffffffffffffee0 >> 0x20),(int)in_stack_fffffffffffffee0);
        local_80 = local_80 + 1;
      }
      Point2<int>::Point2((Point2<int> *)in_stack_fffffffffffffee0,in_stack_fffffffffffffedc,
                          in_stack_fffffffffffffed8);
      Point2<int>::Point2((Point2<int> *)in_stack_fffffffffffffee0,in_stack_fffffffffffffedc,
                          in_stack_fffffffffffffed8);
      Bounds2<int>::Bounds2
                ((Bounds2<int> *)in_stack_fffffffffffffef0,(Point2<int> *)p1,
                 (Point2<int> *)in_stack_fffffffffffffee0);
      p1 = (span<float> *)
           &(in_RDI->tileHashes).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
            _M_impl.super__Vector_impl_data._M_end_of_storage;
      pstd::MakeSpan<std::vector<pstd::span<float>,_std::allocator<pstd::span<float>_>_>_>
                ((vector<pstd::span<float>,_std::allocator<pstd::span<float>_>_> *)
                 in_stack_fffffffffffffee0);
      __args.pMax.super_Tuple2<pbrt::Point2,_int> = TVar8;
      __args.pMin.super_Tuple2<pbrt::Point2,_int> = TVar9;
      __args_1.n = (size_t)in_stack_fffffffffffffef0;
      __args_1.ptr = p1;
      std::function<void_(pbrt::Bounds2<int>,_pstd::span<pstd::span<float>_>)>::operator()
                (in_stack_fffffffffffffee0,__args,__args_1);
      local_cc = 0;
      while( true ) {
        in_stack_fffffffffffffee0 =
             (function<void_(pbrt::Bounds2<int>,_pstd::span<pstd::span<float>_>)> *)(long)local_cc;
        pfVar11 = (function<void_(pbrt::Bounds2<int>,_pstd::span<pstd::span<float>_>)> *)
                  std::
                  vector<pbrt::DisplayItem::ImageChannelBuffer,_std::allocator<pbrt::DisplayItem::ImageChannelBuffer>_>
                  ::size((vector<pbrt::DisplayItem::ImageChannelBuffer,_std::allocator<pbrt::DisplayItem::ImageChannelBuffer>_>
                          *)&in_RDI[1].tileHashes.
                             super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                             _M_impl.super__Vector_impl_data._M_finish);
        if (pfVar11 <= in_stack_fffffffffffffee0) break;
        std::
        vector<pbrt::DisplayItem::ImageChannelBuffer,_std::allocator<pbrt::DisplayItem::ImageChannelBuffer>_>
        ::operator[]((vector<pbrt::DisplayItem::ImageChannelBuffer,_std::allocator<pbrt::DisplayItem::ImageChannelBuffer>_>
                      *)&in_RDI[1].tileHashes.
                         super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                         super__Vector_impl_data._M_finish,(long)local_cc);
        bVar1 = ImageChannelBuffer::SendIfChanged(in_RDI,ipcChannel_00,(int)(sVar2 >> 0x20));
        in_stack_fffffffffffffedc = CONCAT13(bVar1,(int3)in_stack_fffffffffffffedc);
        if (!bVar1) {
          *(undefined1 *)
           &(in_RDI->buffer).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
            _M_impl.super__Vector_impl_data._M_start = 0;
          local_1 = 0;
          goto LAB_00860415;
        }
        local_cc = local_cc + 1;
      }
      local_64 = local_64 + 1;
    }
  }
  local_1 = 1;
LAB_00860415:
  std::vector<pstd::span<float>,_std::allocator<pstd::span<float>_>_>::~vector
            ((vector<pstd::span<float>,_std::allocator<pstd::span<float>_>_> *)
             in_stack_fffffffffffffef0);
LAB_00860422:
  return (bool)(local_1 & 1);
}

Assistant:

bool DisplayItem::Display(IPCChannel &ipcChannel) {
    if (!openedImage) {
        if (!SendOpenImage(ipcChannel))
            // maybe next time
            return false;
        openedImage = true;
    }

    std::vector<pstd::span<Float>> displayValues(channelBuffers.size());
    for (int c = 0; c < channelBuffers.size(); ++c) {
        Float *ptr = (Float *)(channelBuffers[c].buffer.data() +
                               channelBuffers[c].channelValuesOffset);
        displayValues[c] = pstd::MakeSpan(ptr, tileSize * tileSize);
    }

    int tileIndex = 0;
    for (int y = 0; y < resolution.y; y += tileSize)
        for (int x = 0; x < resolution.x; x += tileSize, ++tileIndex) {
            int height = std::min(y + tileSize, resolution.y) - y;
            int width = std::min(x + tileSize, resolution.x) - x;

            for (int c = 0; c < channelBuffers.size(); ++c)
                channelBuffers[c].SetTileBounds(x, y, width, height);

            Bounds2i b(Point2i(x, y), Point2i(x + width, y + height));
            getTileValues(b, pstd::MakeSpan(displayValues));

            // Send the RGB buffers only if they're different than
            // the last version sent.
            for (int c = 0; c < channelBuffers.size(); ++c)
                if (!channelBuffers[c].SendIfChanged(ipcChannel, tileIndex)) {
                    // Welp. Stop for now...
                    openedImage = false;
                    return false;
                }
        }

    return true;
}